

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aead80pq_inplace.c
# Opt level: O2

void test_aead80pq_inplace(void)

{
  _Bool _Var1;
  vecs_err_t vVar2;
  int iVar3;
  unsigned_long_long atto_idx;
  size_t sVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  uint8_t *puVar8;
  long lVar9;
  undefined8 uStack_1b0;
  _Bool local_199;
  vecs_ctx_t ctx_1;
  vecs_ctx_t ctx;
  vecs_aead_t testcase;
  uint8_t obtained_tag [16];
  uint8_t transformed [32];
  byte local_50;
  
  puts("Testing Ascon-80pq en/decryption in-place...");
  vVar2 = vecs_init(&ctx,"vectors/aead80pq.txt",0x14);
  if (vVar2 == VECS_OK) {
    do {
      vVar2 = vecs_aead_next(&ctx,&testcase);
      sVar4 = testcase.plaintext_len;
      if (vVar2 == VECS_EOF) goto LAB_0010e5d8;
      atto_counter = testcase.count;
      if (vVar2 != VECS_OK) {
        uStack_1b0 = 0x23;
        goto LAB_0010e5c6;
      }
      if (testcase.plaintext_len != testcase.ciphertext_len) {
        uStack_1b0 = 0x24;
        goto LAB_0010e5c6;
      }
      memcpy(transformed,testcase.plaintext,testcase.plaintext_len);
      ascon_aead80pq_encrypt
                (transformed,(uint8_t *)&ctx_1,testcase.key,testcase.nonce,testcase.assoc_data,
                 transformed,testcase.assoc_data_len,sVar4,0x10);
      vecs_aead_enc_log(&testcase,transformed,(uint8_t *)&ctx_1,testcase.ciphertext_len);
      sVar4 = testcase.ciphertext_len;
      iVar3 = bcmp(transformed,testcase.ciphertext,testcase.ciphertext_len);
      if (iVar3 != 0) {
        uStack_1b0 = 0x35;
        goto LAB_0010e5c6;
      }
      if (ctx_1 != (vecs_ctx_t)testcase.tag) {
        uStack_1b0 = 0x36;
        goto LAB_0010e5c6;
      }
      _Var1 = ascon_aead80pq_decrypt
                        (transformed,testcase.key,testcase.nonce,testcase.assoc_data,transformed,
                         (uint8_t *)&ctx_1,testcase.assoc_data_len,sVar4,0x10);
      vecs_aead_dec_log(&testcase,transformed,testcase.plaintext_len);
      if (!_Var1) {
        uStack_1b0 = 0x45;
        goto LAB_0010e5c6;
      }
      iVar3 = bcmp(transformed,testcase.plaintext,testcase.plaintext_len);
    } while (iVar3 == 0);
    uStack_1b0 = 0x48;
  }
  else {
    uStack_1b0 = 0x19;
  }
LAB_0010e5c6:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead80pq_inplace.c"
         ,uStack_1b0,"test_inplace_offline",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_0010e5d8:
  vVar2 = vecs_init(&ctx_1,"vectors/aead80pq.txt",0x14);
  if (vVar2 == VECS_OK) {
    while( true ) {
      vVar2 = vecs_aead_next(&ctx_1,&testcase);
      if (vVar2 == VECS_EOF) break;
      atto_counter = testcase.count;
      if (vVar2 != VECS_OK) {
        uStack_1b0 = 0x61;
        goto LAB_0010ec82;
      }
      if (testcase.plaintext_len != testcase.ciphertext_len) {
        uStack_1b0 = 0x62;
        goto LAB_0010ec82;
      }
      memcpy(&ctx,testcase.plaintext,testcase.plaintext_len);
      ascon_aead80pq_init((ascon_aead_ctx_t *)transformed,testcase.key,testcase.nonce);
      puVar8 = testcase.assoc_data;
      uVar7 = 0;
      bVar6 = 1;
      while (uVar7 < testcase.assoc_data_len) {
        ascon_aead80pq_assoc_data_update((ascon_aead_ctx_t *)transformed,puVar8,1);
        uVar7 = uVar7 + 1;
        bVar5 = bVar6 & 7;
        bVar6 = bVar6 + 1;
        puVar8 = puVar8 + 1;
        if (bVar5 != local_50) {
          uStack_1b0 = 0x6b;
          goto LAB_0010ec82;
        }
      }
      lVar9 = 0;
      for (uVar7 = 0; puVar8 = (uint8_t *)((long)&ctx.handle + lVar9),
          uVar7 < testcase.plaintext_len; uVar7 = uVar7 + 1) {
        sVar4 = ascon_aead80pq_encrypt_update
                          ((ascon_aead_ctx_t *)transformed,puVar8,
                           (uint8_t *)((long)&ctx.handle + uVar7),1);
        if (((int)uVar7 + 1U & 7) != (uint)local_50) {
          uStack_1b0 = 0x75;
          goto LAB_0010ec82;
        }
        if (local_50 == 0) {
          if (sVar4 != 8) {
            uStack_1b0 = 0x78;
            goto LAB_0010ec82;
          }
        }
        else if (sVar4 != 0) {
          uStack_1b0 = 0x7c;
          goto LAB_0010ec82;
        }
        lVar9 = lVar9 + sVar4;
      }
      sVar4 = ascon_aead80pq_encrypt_final((ascon_aead_ctx_t *)transformed,puVar8,obtained_tag,0x10)
      ;
      if (7 < sVar4) {
        uStack_1b0 = 0x85;
        goto LAB_0010ec82;
      }
      if (sVar4 != ((uint)testcase.ciphertext_len & 7)) {
        uStack_1b0 = 0x86;
        goto LAB_0010ec82;
      }
      if (sVar4 + lVar9 != testcase.ciphertext_len) {
        uStack_1b0 = 0x87;
        goto LAB_0010ec82;
      }
      vecs_aead_enc_log(&testcase,(uint8_t *)&ctx,obtained_tag,sVar4 + lVar9);
      iVar3 = bcmp(&ctx,testcase.ciphertext,testcase.ciphertext_len);
      if (iVar3 != 0) {
        uStack_1b0 = 0x8c;
        goto LAB_0010ec82;
      }
      if (obtained_tag != testcase.tag) {
        uStack_1b0 = 0x8d;
        goto LAB_0010ec82;
      }
      lVar9 = 0;
      while (lVar9 != 0x58) {
        puVar8 = transformed + lVar9;
        lVar9 = lVar9 + 1;
        if (*puVar8 != '\0') {
          uStack_1b0 = 0x8e;
          goto LAB_0010ec82;
        }
      }
      ascon_aead80pq_init((ascon_aead_ctx_t *)transformed,testcase.key,testcase.nonce);
      puVar8 = testcase.assoc_data;
      uVar7 = 0;
      bVar6 = 1;
      while (uVar7 < testcase.assoc_data_len) {
        ascon_aead80pq_assoc_data_update((ascon_aead_ctx_t *)transformed,puVar8,1);
        uVar7 = uVar7 + 1;
        bVar5 = bVar6 & 7;
        bVar6 = bVar6 + 1;
        puVar8 = puVar8 + 1;
        if (bVar5 != local_50) {
          uStack_1b0 = 0x97;
          goto LAB_0010ec82;
        }
      }
      lVar9 = 0;
      for (uVar7 = 0; puVar8 = (uint8_t *)((long)&ctx.handle + lVar9),
          uVar7 < testcase.ciphertext_len; uVar7 = uVar7 + 1) {
        sVar4 = ascon_aead80pq_decrypt_update
                          ((ascon_aead_ctx_t *)transformed,puVar8,
                           (uint8_t *)((long)&ctx.handle + uVar7),1);
        if (((int)uVar7 + 1U & 7) != (uint)local_50) {
          uStack_1b0 = 0xa1;
          goto LAB_0010ec82;
        }
        if (local_50 == 0) {
          if (sVar4 != 8) {
            uStack_1b0 = 0xa4;
            goto LAB_0010ec82;
          }
        }
        else if (sVar4 != 0) {
          uStack_1b0 = 0xa8;
          goto LAB_0010ec82;
        }
        lVar9 = lVar9 + sVar4;
      }
      sVar4 = ascon_aead80pq_decrypt_final
                        ((ascon_aead_ctx_t *)transformed,puVar8,&local_199,testcase.tag,0x10);
      if (7 < sVar4) {
        uStack_1b0 = 0xb0;
        goto LAB_0010ec82;
      }
      if (sVar4 != ((uint)testcase.plaintext_len & 7)) {
        uStack_1b0 = 0xb1;
        goto LAB_0010ec82;
      }
      if (sVar4 + lVar9 != testcase.plaintext_len) {
        uStack_1b0 = 0xb2;
        goto LAB_0010ec82;
      }
      vecs_aead_dec_log(&testcase,(uint8_t *)&ctx,sVar4 + lVar9);
      if (local_199 == false) {
        uStack_1b0 = 0xb4;
        goto LAB_0010ec82;
      }
      iVar3 = bcmp(&ctx,testcase.plaintext,testcase.plaintext_len);
      if (iVar3 != 0) {
        uStack_1b0 = 0xb7;
        goto LAB_0010ec82;
      }
      lVar9 = 0;
      while (lVar9 != 0x58) {
        puVar8 = transformed + lVar9;
        lVar9 = lVar9 + 1;
        if (*puVar8 != '\0') {
          uStack_1b0 = 0xb8;
          goto LAB_0010ec82;
        }
      }
    }
  }
  else {
    uStack_1b0 = 0x53;
LAB_0010ec82:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead80pq_inplace.c"
           ,uStack_1b0,"test_inplace_update_single_byte",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  return;
}

Assistant:

void test_aead80pq_inplace(void)
{
    puts("Testing Ascon-80pq en/decryption in-place...");
    test_inplace_offline();
    test_inplace_update_single_byte();
}